

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  URLPatternType UVar1;
  char **ppcVar2;
  int iVar3;
  char *__ptr;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  URLGlob *pUVar8;
  size_t __n;
  char *__s;
  char numbuf [18];
  char *local_68;
  URLGlob *local_60;
  size_t local_58;
  char **local_50;
  char local_48 [24];
  
  *result = (char *)0x0;
  local_68 = filename;
  local_60 = glob;
  local_58 = strlen(filename);
  local_58 = local_58 + 1;
  __ptr = (char *)malloc(local_58);
  if (__ptr == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  __s = (char *)0x0;
  __n = 0;
  uVar7 = 0;
  local_50 = result;
  do {
    if (*filename == '#') {
      iVar3 = Curl_isdigit((uint)(byte)filename[1]);
      if (iVar3 != 0) {
        uVar4 = strtoul(filename + 1,&local_68,10);
        uVar6 = local_60->size;
        if (uVar4 < uVar6) {
          pUVar8 = local_60;
          do {
            if (pUVar8->pattern[0].globindex == (int)uVar4 + -1) {
              UVar1 = pUVar8->pattern[0].type;
              if (UVar1 == UPTNumRange) {
                __s = local_48;
                curl_msnprintf(__s,0x12,"%0*lu",pUVar8->pattern[0].content.NumRange.padlength,
                               pUVar8->pattern[0].content.NumRange.ptr_n);
              }
              else {
                if (UVar1 == UPTCharRange) {
                  local_48[0] = pUVar8->pattern[0].content.CharRange.ptr_c;
                  local_48[1] = 0;
                  __n = 1;
                  __s = local_48;
                  goto LAB_0011afb2;
                }
                if (UVar1 != UPTSet) {
                  curl_mfprintf(_stderr,"internal error: invalid pattern type (%d)\n");
                  free(__ptr);
                  return CURLE_FAILED_INIT;
                }
                ppcVar2 = pUVar8->pattern[0].content.Set.elements;
                if (ppcVar2 == (char **)0x0) goto LAB_0011afb2;
                __s = ppcVar2[pUVar8->pattern[0].content.Set.ptr_s];
              }
              __n = strlen(__s);
              goto LAB_0011afb2;
            }
            pUVar8 = (URLGlob *)(pUVar8->pattern + 1);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
      }
    }
    else if (*filename == '\0') {
      __ptr[uVar7] = '\0';
      *local_50 = __ptr;
      return CURLE_OK;
    }
    local_68 = filename + 1;
    __n = 1;
    __s = filename;
LAB_0011afb2:
    uVar6 = uVar7 + __n;
    pcVar5 = __ptr;
    if (local_58 <= uVar6) {
      pcVar5 = (char *)realloc(__ptr,uVar6 * 2 + 1);
      if (pcVar5 == (char *)0x0) {
        free(__ptr);
        return CURLE_OUT_OF_MEMORY;
      }
      local_58 = uVar6 * 2;
    }
    memcpy(pcVar5 + uVar7,__s,__n);
    uVar7 = uVar6;
    filename = local_68;
    __ptr = pcVar5;
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = NULL;
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      URLPattern *pat = NULL;

      if(num < glob->size) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          snprintf(numbuf, sizeof(numbuf), "%0*lu",
                   pat->content.NumRange.padlength,
                   pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, target,
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    Curl_safefree(target);
    if(sc)
      return CURLE_URL_MALFORMAT;
    target = sanitized;
  }
#endif /* MSDOS || WIN32 */

  *result = target;
  return CURLE_OK;
}